

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_MonitoredItem * UA_MonitoredItem_new(void)

{
  UA_MonitoredItem *pUVar1;
  
  pUVar1 = (UA_MonitoredItem *)malloc(0xa8);
  if (pUVar1 == (UA_MonitoredItem *)0x0) {
    pUVar1 = (UA_MonitoredItem *)0x0;
  }
  else {
    pUVar1->subscription = (UA_Subscription *)0x0;
    pUVar1->currentQueueSize = 0;
    pUVar1->maxQueueSize = 0;
    pUVar1->timestampsToReturn = UA_TIMESTAMPSTORETURN_SOURCE;
    (pUVar1->indexRange).length = 0;
    (pUVar1->indexRange).data = (UA_Byte *)0x0;
    (pUVar1->queue).tqh_first = (MonitoredItem_queuedValue *)0x0;
    (pUVar1->queue).tqh_last = &(pUVar1->queue).tqh_first;
    (pUVar1->monitoredNodeId).namespaceIndex = 0;
    *(undefined2 *)&(pUVar1->monitoredNodeId).field_0x2 = 0;
    (pUVar1->monitoredNodeId).identifierType = UA_NODEIDTYPE_NUMERIC;
    (pUVar1->monitoredNodeId).identifier.string.length = 0;
    (pUVar1->monitoredNodeId).identifier.string.data = (UA_Byte *)0x0;
    (pUVar1->lastSampledValue).length = 0;
    (pUVar1->lastSampledValue).data = (UA_Byte *)0x0;
    pUVar1->itemId = 0;
    pUVar1->monitoredItemType = UA_MONITOREDITEMTYPE_CHANGENOTIFY;
    (pUVar1->sampleJobGuid).data1 = 0;
    (pUVar1->sampleJobGuid).data2 = 0;
    (pUVar1->sampleJobGuid).data3 = 0;
    (pUVar1->sampleJobGuid).data4[0] = '\0';
    (pUVar1->sampleJobGuid).data4[1] = '\0';
    (pUVar1->sampleJobGuid).data4[2] = '\0';
    (pUVar1->sampleJobGuid).data4[3] = '\0';
    (pUVar1->sampleJobGuid).data4[4] = '\0';
    (pUVar1->sampleJobGuid).data4[5] = '\0';
    (pUVar1->sampleJobGuid).data4[6] = '\0';
    (pUVar1->sampleJobGuid).data4[7] = '\0';
    pUVar1->sampleJobIsRegistered = false;
  }
  return pUVar1;
}

Assistant:

UA_MonitoredItem * UA_MonitoredItem_new() {
    UA_MonitoredItem *new = UA_malloc(sizeof(UA_MonitoredItem));
    if(!new)
        return NULL;
    new->subscription = NULL;
    new->currentQueueSize = 0;
    new->maxQueueSize = 0;
    new->monitoredItemType = UA_MONITOREDITEMTYPE_CHANGENOTIFY; /* currently hardcoded */
    new->timestampsToReturn = UA_TIMESTAMPSTORETURN_SOURCE;
    UA_String_init(&new->indexRange);
    TAILQ_INIT(&new->queue);
    UA_NodeId_init(&new->monitoredNodeId);
    new->lastSampledValue = UA_BYTESTRING_NULL;
    memset(&new->sampleJobGuid, 0, sizeof(UA_Guid));
    new->sampleJobIsRegistered = false;
    new->itemId = 0;
    return new;
}